

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_opt.cpp
# Opt level: O1

void compute_integral_img_faster_alg(float *gray_image,integral_image *iimage)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  long lVar5;
  ulong uVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  long lVar13;
  ulong uVar14;
  float *pfVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  
  lVar18 = (long)iimage->data_width;
  uVar2 = iimage->width;
  lVar8 = (long)(int)uVar2;
  uVar3 = iimage->height;
  uVar17 = (ulong)uVar2;
  pfVar15 = iimage->data;
  if (lVar8 < 3) {
    uVar6 = 0;
    fVar20 = 0.0;
    fVar19 = 0.0;
  }
  else {
    fVar19 = 0.0;
    uVar6 = 0;
    fVar20 = 0.0;
    do {
      fVar4 = fVar19 + gray_image[uVar6];
      pfVar15[uVar6] = fVar4;
      fVar19 = fVar4 + gray_image[uVar6 + 1];
      pfVar15[uVar6 + 1] = fVar19;
      fVar1 = gray_image[uVar17 + uVar6];
      pfVar15[lVar18 + uVar6] = fVar4 + fVar20 + fVar1;
      fVar20 = fVar20 + fVar1 + gray_image[uVar17 + uVar6 + 1];
      pfVar15[lVar18 + uVar6 + 1] = fVar20 + pfVar15[uVar6 + 1];
      uVar6 = uVar6 + 2;
    } while ((long)uVar6 < lVar8 + -2);
  }
  if ((int)uVar6 < (int)uVar2) {
    uVar6 = uVar6 & 0xffffffff;
    do {
      fVar19 = fVar19 + gray_image[uVar6];
      pfVar15[uVar6] = fVar19;
      fVar20 = fVar20 + gray_image[lVar8 + uVar6];
      pfVar15[lVar18 + uVar6] = fVar19 + fVar20;
      uVar6 = uVar6 + 1;
    } while (uVar17 != uVar6);
  }
  uVar6 = 2;
  lVar8 = (long)(int)(lVar8 + -2);
  if (4 < (int)uVar3) {
    local_68 = pfVar15 + lVar18;
    lVar5 = (long)(int)uVar2;
    pfVar10 = pfVar15 + lVar18 * 3 + 1;
    pfVar12 = gray_image + lVar5 * 3 + 1;
    pfVar11 = pfVar15 + lVar18 + 1;
    pfVar9 = pfVar15 + lVar18 * 2 + 1;
    pfVar16 = gray_image + lVar5 * 2 + 1;
    local_70 = pfVar15 + lVar18 * 3;
    local_78 = gray_image + lVar5 * 3;
    local_80 = pfVar15 + lVar18 * 2;
    pfVar7 = gray_image + lVar5 * 2;
    uVar6 = 2;
    do {
      fVar20 = 0.0;
      fVar19 = 0.0;
      uVar14 = 0;
      if (2 < (int)uVar2) {
        uVar14 = 0;
        do {
          fVar1 = pfVar16[uVar14 - 1];
          fVar4 = fVar19 + fVar1 + pfVar11[uVar14 - 1];
          pfVar9[uVar14 - 1] = fVar4;
          fVar19 = fVar19 + fVar1 + pfVar16[uVar14];
          pfVar9[uVar14] = fVar19 + pfVar11[uVar14];
          fVar1 = pfVar12[uVar14 - 1];
          pfVar10[uVar14 - 1] = fVar4 + fVar20 + fVar1;
          fVar20 = fVar20 + fVar1 + pfVar12[uVar14];
          pfVar10[uVar14] = fVar20 + pfVar9[uVar14];
          uVar14 = uVar14 + 2;
        } while ((long)uVar14 < lVar8);
      }
      if ((int)uVar14 < (int)uVar2) {
        uVar14 = uVar14 & 0xffffffff;
        lVar13 = 0;
        do {
          fVar19 = fVar19 + pfVar7[uVar14 + lVar13];
          fVar1 = local_68[uVar14 + lVar13];
          local_80[uVar14 + lVar13] = fVar19 + fVar1;
          fVar20 = fVar20 + local_78[uVar14 + lVar13];
          local_70[uVar14 + lVar13] = fVar19 + fVar1 + fVar20;
          lVar13 = lVar13 + 1;
        } while (uVar17 - uVar14 != lVar13);
      }
      uVar6 = uVar6 + 2;
      pfVar10 = pfVar10 + lVar18 * 2;
      pfVar12 = pfVar12 + lVar5 * 2;
      pfVar11 = pfVar11 + lVar18 * 2;
      pfVar9 = pfVar9 + lVar18 * 2;
      pfVar16 = pfVar16 + lVar5 * 2;
      local_70 = local_70 + lVar18 * 2;
      local_78 = local_78 + lVar5 * 2;
      local_80 = local_80 + lVar18 * 2;
      local_68 = local_68 + lVar18 * 2;
      pfVar7 = pfVar7 + lVar5 * 2;
    } while ((long)uVar6 < (long)(int)uVar3 + -2);
  }
  if ((int)uVar6 < (int)uVar3) {
    uVar6 = uVar6 & 0xffffffff;
    lVar5 = (long)(int)uVar2;
    pfVar12 = pfVar15 + lVar18 * uVar6 + 1;
    lVar13 = (uVar6 - 1) * lVar18;
    pfVar11 = pfVar15 + lVar13 + 1;
    pfVar9 = gray_image + lVar5 * uVar6 + 1;
    pfVar7 = pfVar15 + lVar18 * uVar6;
    pfVar15 = pfVar15 + lVar13;
    pfVar10 = gray_image + lVar5 * uVar6;
    do {
      fVar19 = 0.0;
      uVar17 = 0;
      if (2 < (int)uVar2) {
        uVar17 = 0;
        do {
          fVar20 = pfVar9[uVar17 - 1];
          pfVar12[uVar17 - 1] = fVar19 + fVar20 + pfVar11[uVar17 - 1];
          fVar19 = fVar19 + fVar20 + pfVar9[uVar17];
          pfVar12[uVar17] = fVar19 + pfVar11[uVar17];
          uVar17 = uVar17 + 2;
        } while ((long)uVar17 < lVar8);
      }
      if ((int)uVar17 < (int)uVar2) {
        uVar17 = uVar17 & 0xffffffff;
        do {
          fVar19 = fVar19 + pfVar10[uVar17];
          pfVar7[uVar17] = fVar19 + pfVar15[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar2 != uVar17);
      }
      uVar6 = uVar6 + 1;
      pfVar12 = pfVar12 + lVar18;
      pfVar11 = pfVar11 + lVar18;
      pfVar9 = pfVar9 + lVar5;
      pfVar7 = pfVar7 + lVar18;
      pfVar15 = pfVar15 + lVar18;
      pfVar10 = pfVar10 + lVar5;
    } while (uVar6 != uVar3);
  }
  return;
}

Assistant:

void compute_integral_img_faster_alg(float *gray_image, struct integral_image * iimage) {
    
    float sum = 0.0f;
    float sum1 = 0.0f;
    
    int data_width = iimage->data_width;
    int width = iimage->width;
    int width_limit = width - 2;
    int height_limit = iimage->height - 2;
    float *iimage_data = iimage->data;

    int i = 0;
    // first row extra, since we don't have 0 padding
    for (i = 0; i < width_limit; i += 2) {
        sum += gray_image[i];
        iimage_data[i] = sum;
        sum += gray_image[i + 1];
        iimage_data[i + 1] = sum;

        sum1 += gray_image[width + i];
        iimage_data[data_width + i] = iimage_data[i] + sum1;
        sum1 += gray_image[width + i + 1];
        iimage_data[data_width + i + 1] = iimage_data[i + 1] + sum1;
    }

    // Handle last element of an image with odd width extra.
    // If previous stride = 2, then there should only be one element covered in this loop.
    // This might change if we increase the stride.
    for (; i < width; ++i) {
        sum += gray_image[i];
        iimage_data[i] = sum;
        // printf("row 0, col %i sum: %f\n", i, sum);
        sum1 += gray_image[width + i];
        // printf("row 1, col %i sum: %f\n", i, sum1);
        iimage_data[data_width + i] = iimage_data[i] + sum1;
    }

    // Handle all elements after the first row.
    i = 2;
    for (; i < height_limit; i += 2) {
        sum = 0.0f;
        sum1 = 0.0f;
        int j = 0;
        for (; j < width_limit; j += 2) {
            sum += gray_image[i * width + j];
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            sum += gray_image[i * width + j + 1];
            iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;

            sum1 += gray_image[(i + 1) * width + j];
            iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
            sum1 += gray_image[(i + 1) * width + j + 1];
            iimage_data[(i + 1) * data_width + j + 1] = iimage_data[i * data_width + j + 1] + sum1;
        }
        // printf("j: %i\n", j);

        // Handle last element of an image with odd width extra.
        // If previous stride = 2, then there should only be one element covered in this loop.
        // This might change if we increase the stride.
        for (; j < width; ++j) {
            // printf("j: %i; sum1: %f\n", j, sum1);
            sum += gray_image[i * width + j];
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;

            sum1 += gray_image[(i + 1) * width + j];
            // printf("sum1: %f\n", sum1);
            iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
        }
    }

    // Handle last element of an image with odd height extra.
    // If previous stride = 2, then there should only be one row covered in this loop.
    // This might change if we increase the stride.
    for (; i < iimage->height ; ++i) {
        sum = 0.0f;
        int j = 0;
        for (; j < width_limit; j += 2) {
            // printf("j: %i; sum1: %f\n", j, sum);

            sum += gray_image[i * width + j];
            // printf("j: %i; sum1: %f\n", j, sum);
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            sum += gray_image[i * width + j + 1];
            // printf("j: %i; sum1: %f\n", j, sum);

            iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;
        }
        // printf("j: %i\n", j);

        for (; j < width; ++j) {
            sum += gray_image[i * width + j];
            // printf("j: %i; sum1: %f\n", j, sum);

            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
        }
    }
}